

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O2

REF_STATUS ref_search_insert(REF_SEARCH ref_search,REF_INT item,REF_DBL *position,REF_DBL radius)

{
  int child;
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  long lVar4;
  char *pcVar5;
  
  child = ref_search->empty;
  if (child < ref_search->n) {
    if (-1 < item) {
      ref_search->empty = child + 1;
      ref_search->item[child] = item;
      iVar1 = ref_search->d;
      for (lVar4 = 0; lVar4 < iVar1; lVar4 = lVar4 + 1) {
        ref_search->pos[iVar1 * child + lVar4] = position[lVar4];
      }
      ref_search->radius[child] = radius;
      uVar2 = ref_search_home(ref_search,child,0);
      if (uVar2 == 0) {
        return 0;
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",0x88
             ,"ref_search_insert",(ulong)uVar2,"top level home");
      return 1;
    }
    pcVar5 = "item can not be negative";
    uVar3 = 0x7e;
    uVar2 = 3;
  }
  else {
    pcVar5 = "need larger tree for more items";
    uVar3 = 0x7c;
    uVar2 = 7;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",uVar3,
         "ref_search_insert",(ulong)uVar2,pcVar5);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_search_insert(REF_SEARCH ref_search, REF_INT item,
                                     REF_DBL *position, REF_DBL radius) {
  REF_INT i, location;
  if (ref_search->empty >= ref_search->n)
    RSS(REF_INCREASE_LIMIT, "need larger tree for more items");

  if (item < 0) RSS(REF_INVALID, "item can not be negative");

  location = ref_search->empty;
  (ref_search->empty)++;

  ref_search->item[location] = item;
  for (i = 0; i < ref_search->d; i++)
    ref_search->pos[i + ref_search->d * location] = position[i];
  ref_search->radius[location] = radius;

  RSS(ref_search_home(ref_search, location, 0), "top level home");

  return REF_SUCCESS;
}